

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUUtils.cpp
# Opt level: O3

String * COLLADABU::Utils::replaceDot(String *__return_storage_ptr__,String *text)

{
  ulong uVar1;
  stringstream stream;
  char local_1b1;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (text->_M_string_length != 0) {
    uVar1 = 0;
    do {
      local_1b1 = (text->_M_dataplus)._M_p[uVar1];
      if (local_1b1 == '.') {
        local_1b1 = '_';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < text->_M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

String Utils::replaceDot ( const String &text )
    {
        std::stringstream stream;

        for ( size_t i = 0; i < text.length(); ++i )
        {
            if ( text[i] == '.' )
                stream << '_';
            else
                stream << text[i];
        }

        return stream.str();
    }